

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O1

void __thiscall
Minisat::Solver::toDimacs(Solver *this,FILE *f,Clause *c,vec<int,_int> *map,Var_conflict *max)

{
  byte bVar1;
  Clause CVar2;
  bool bVar3;
  Var_conflict VVar4;
  char *pcVar5;
  ulong uVar6;
  
  bVar3 = satisfied(this,c);
  if (bVar3) {
    return;
  }
  if (0x1f < (uint)c->header) {
    uVar6 = 0;
    do {
      CVar2.header = c[uVar6 + 1].header;
      bVar1 = (this->assigns).super_IntMap<int,_Minisat::lbool,_Minisat::MkIndexDefault<int>_>.map.
              data[(int)CVar2.header >> 1].value;
      if (((CVar2.header._0_1_ & 1 ^ bVar1) != l_False || (l_False & 2) != 0) &&
          (bVar1 & l_False & 2) == 0) {
        pcVar5 = "-";
        if (((uint)CVar2.header & 1) == 0) {
          pcVar5 = "";
        }
        VVar4 = mapVar((int)CVar2.header >> 1,map,max);
        fprintf((FILE *)f,"%s%d ",pcVar5,(ulong)(VVar4 + 1));
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 < (uint)c->header >> 5);
  }
  fwrite("0\n",2,1,(FILE *)f);
  return;
}

Assistant:

void Solver::toDimacs(FILE* f, Clause& c, vec<Var>& map, Var& max)
{
    if (satisfied(c)) return;

    for (int i = 0; i < c.size(); i++)
        if (value(c[i]) != l_False)
            fprintf(f, "%s%d ", sign(c[i]) ? "-" : "", mapVar(var(c[i]), map, max)+1);
    fprintf(f, "0\n");
}